

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# socks.c
# Opt level: O0

CURLcode Curl_SOCKS4(char *proxy_name,char *hostname,int remote_port,int sockindex,connectdata *conn
                    ,_Bool protocol4a)

{
  int iVar1;
  long lVar2;
  size_t sVar3;
  char *pcVar4;
  long lStack_1d0;
  int packetsize;
  ssize_t hostnamelen;
  ssize_t written;
  ssize_t actualread;
  size_t plen;
  unsigned_short ip [4];
  char buf [64];
  Curl_addrinfo *pCStack_160;
  int rc;
  Curl_addrinfo *hp;
  Curl_dns_entry *dns;
  SessionHandle *data;
  CURLcode local_140;
  curl_socket_t sock;
  CURLcode code;
  int result;
  uchar socksreq [262];
  _Bool protocol4a_local;
  connectdata *conn_local;
  int sockindex_local;
  int remote_port_local;
  char *hostname_local;
  char *proxy_name_local;
  
  data._4_4_ = conn->sock[sockindex];
  dns = (Curl_dns_entry *)conn->data;
  socksreq[0xff] = protocol4a;
  unique0x10000470 = conn;
  lVar2 = Curl_timeleft((SessionHandle *)dns,(timeval *)0x0,true);
  if (lVar2 < 0) {
    Curl_failf((SessionHandle *)dns,"Connection time-out");
    return CURLE_OPERATION_TIMEDOUT;
  }
  curlx_nonblock(data._4_4_,0);
  Curl_infof((SessionHandle *)dns,"SOCKS4 communication to %s:%d\n",hostname,
             (ulong)(uint)remote_port);
  code._0_1_ = CURLE_NOT_BUILT_IN;
  code._1_1_ = 1;
  code._2_1_ = (undefined1)((uint)remote_port >> 8);
  code._3_1_ = (undefined1)remote_port;
  if ((socksreq[0xff] & 1) == 0) {
    pCStack_160 = (Curl_addrinfo *)0x0;
    iVar1 = Curl_resolv(stack0xffffffffffffffd0,hostname,remote_port,(Curl_dns_entry **)&hp);
    if (iVar1 == -1) {
      return CURLE_COULDNT_RESOLVE_PROXY;
    }
    if (hp != (Curl_addrinfo *)0x0) {
      pCStack_160 = *(Curl_addrinfo **)hp;
    }
    if (pCStack_160 != (Curl_addrinfo *)0x0) {
      Curl_printable_address(pCStack_160,(char *)ip,0x40);
      iVar1 = __isoc99_sscanf(ip,"%hu.%hu.%hu.%hu",&plen,(long)&plen + 2,(long)&plen + 4,
                              (long)&plen + 6);
      if (iVar1 == 4) {
        result._0_1_ = (byte)plen;
        result._1_1_ = plen._2_1_;
        result._2_1_ = plen._4_1_;
        result._3_1_ = plen._6_1_;
      }
      else {
        pCStack_160 = (Curl_addrinfo *)0x0;
      }
      Curl_infof((SessionHandle *)dns,"SOCKS4 connect to %s (locally resolved)\n",ip);
      Curl_resolv_unlock((SessionHandle *)dns,(Curl_dns_entry *)hp);
    }
    if (pCStack_160 == (Curl_addrinfo *)0x0) {
      Curl_failf((SessionHandle *)dns,"Failed to resolve \"%s\" for SOCKS4 connect.",hostname);
      return CURLE_COULDNT_RESOLVE_HOST;
    }
  }
  socksreq[0] = '\0';
  if (proxy_name != (char *)0x0) {
    actualread = strlen(proxy_name);
    if (0xfd < (ulong)actualread) {
      Curl_failf((SessionHandle *)dns,"Too long SOCKS proxy name, can\'t use!\n");
      return CURLE_COULDNT_CONNECT;
    }
    memcpy(socksreq,proxy_name,actualread + 1);
  }
  lStack_1d0 = 0;
  sVar3 = strlen((char *)socksreq);
  iVar1 = (int)sVar3 + 9;
  if ((socksreq[0xff] & 1) != 0) {
    result._0_1_ = 0;
    result._1_1_ = 0;
    result._2_1_ = 0;
    result._3_1_ = 1;
    sVar3 = strlen(hostname);
    lStack_1d0 = sVar3 + 1;
    if (iVar1 + lStack_1d0 < 0x107) {
      strcpy((char *)((long)&code + (long)iVar1),hostname);
    }
    else {
      lStack_1d0 = 0;
    }
  }
  local_140 = Curl_write_plain(stack0xffffffffffffffd0,data._4_4_,&code,iVar1 + lStack_1d0,
                               &hostnamelen);
  if ((local_140 == CURLE_OK) && (hostnamelen == iVar1 + lStack_1d0)) {
    if (((socksreq[0xff] & 1) != 0) && (lStack_1d0 == 0)) {
      sVar3 = strlen(hostname);
      local_140 = Curl_write_plain(stack0xffffffffffffffd0,data._4_4_,hostname,sVar3 + 1,
                                   &hostnamelen);
      if ((local_140 != CURLE_OK) || (hostnamelen != sVar3 + 1)) {
        Curl_failf((SessionHandle *)dns,"Failed to send SOCKS4 connect request.");
        return CURLE_COULDNT_CONNECT;
      }
    }
    local_140 = 0;
    sock = Curl_blockread_all(stack0xffffffffffffffd0,data._4_4_,(char *)&code,8,&written);
    if ((sock == 0) && (written == 8)) {
      if ((undefined1)code == CURLE_OK) {
        switch(code._1_1_) {
        case 0x5a:
          pcVar4 = "";
          if ((socksreq[0xff] & 1) != 0) {
            pcVar4 = "a";
          }
          Curl_infof((SessionHandle *)dns,"SOCKS4%s request granted.\n",pcVar4);
          curlx_nonblock(data._4_4_,1);
          proxy_name_local._4_4_ = CURLE_OK;
          break;
        case 0x5b:
          Curl_failf((SessionHandle *)dns,
                     "Can\'t complete SOCKS4 connection to %d.%d.%d.%d:%d. (%d), request rejected or failed."
                     ,(ulong)(byte)result,(ulong)result._1_1_,(ulong)result._2_1_,
                     (ulong)result._3_1_,(uint)CONCAT11(socksreq[0],socksreq[1]),
                     (uint)(byte)code._1_1_);
          proxy_name_local._4_4_ = CURLE_COULDNT_CONNECT;
          break;
        case 0x5c:
          Curl_failf((SessionHandle *)dns,
                     "Can\'t complete SOCKS4 connection to %d.%d.%d.%d:%d. (%d), request rejected because SOCKS server cannot connect to identd on the client."
                     ,(ulong)(byte)result,(ulong)result._1_1_,(ulong)result._2_1_,
                     (ulong)result._3_1_,(uint)CONCAT11(socksreq[0],socksreq[1]),
                     (uint)(byte)code._1_1_);
          proxy_name_local._4_4_ = CURLE_COULDNT_CONNECT;
          break;
        case 0x5d:
          Curl_failf((SessionHandle *)dns,
                     "Can\'t complete SOCKS4 connection to %d.%d.%d.%d:%d. (%d), request rejected because the client program and identd report different user-ids."
                     ,(ulong)(byte)result,(ulong)result._1_1_,(ulong)result._2_1_,
                     (ulong)result._3_1_,(uint)CONCAT11(socksreq[0],socksreq[1]),
                     (uint)(byte)code._1_1_);
          proxy_name_local._4_4_ = CURLE_COULDNT_CONNECT;
          break;
        default:
          Curl_failf((SessionHandle *)dns,
                     "Can\'t complete SOCKS4 connection to %d.%d.%d.%d:%d. (%d), Unknown.",
                     (ulong)(byte)result,(ulong)result._1_1_,(ulong)result._2_1_,(ulong)result._3_1_
                     ,(uint)CONCAT11(socksreq[0],socksreq[1]),(uint)(byte)code._1_1_);
          proxy_name_local._4_4_ = CURLE_COULDNT_CONNECT;
        }
      }
      else {
        Curl_failf((SessionHandle *)dns,"SOCKS4 reply has wrong version, version should be 4.");
        proxy_name_local._4_4_ = CURLE_COULDNT_CONNECT;
      }
    }
    else {
      Curl_failf((SessionHandle *)dns,"Failed to receive SOCKS4 connect request ack.");
      proxy_name_local._4_4_ = CURLE_COULDNT_CONNECT;
    }
  }
  else {
    Curl_failf((SessionHandle *)dns,"Failed to send SOCKS4 connect request.");
    proxy_name_local._4_4_ = CURLE_COULDNT_CONNECT;
  }
  return proxy_name_local._4_4_;
}

Assistant:

CURLcode Curl_SOCKS4(const char *proxy_name,
                     const char *hostname,
                     int remote_port,
                     int sockindex,
                     struct connectdata *conn,
                     bool protocol4a)
{
#define SOCKS4REQLEN 262
  unsigned char socksreq[SOCKS4REQLEN]; /* room for SOCKS4 request incl. user
                                           id */
  int result;
  CURLcode code;
  curl_socket_t sock = conn->sock[sockindex];
  struct SessionHandle *data = conn->data;

  if(Curl_timeleft(data, NULL, TRUE) < 0) {
    /* time-out, bail out, go home */
    failf(data, "Connection time-out");
    return CURLE_OPERATION_TIMEDOUT;
  }

  (void)curlx_nonblock(sock, FALSE);

  infof(data, "SOCKS4 communication to %s:%d\n", hostname, remote_port);

  /*
   * Compose socks4 request
   *
   * Request format
   *
   *     +----+----+----+----+----+----+----+----+----+----+....+----+
   *     | VN | CD | DSTPORT |      DSTIP        | USERID       |NULL|
   *     +----+----+----+----+----+----+----+----+----+----+....+----+
   * # of bytes:  1    1      2              4           variable       1
   */

  socksreq[0] = 4; /* version (SOCKS4) */
  socksreq[1] = 1; /* connect */
  socksreq[2] = (unsigned char)((remote_port >> 8) & 0xff); /* PORT MSB */
  socksreq[3] = (unsigned char)(remote_port & 0xff);        /* PORT LSB */

  /* DNS resolve only for SOCKS4, not SOCKS4a */
  if(!protocol4a) {
    struct Curl_dns_entry *dns;
    Curl_addrinfo *hp=NULL;
    int rc;

    rc = Curl_resolv(conn, hostname, remote_port, &dns);

    if(rc == CURLRESOLV_ERROR)
      return CURLE_COULDNT_RESOLVE_PROXY;

    if(rc == CURLRESOLV_PENDING)
      /* ignores the return code, but 'dns' remains NULL on failure */
      (void)Curl_resolver_wait_resolv(conn, &dns);

    /*
     * We cannot use 'hostent' as a struct that Curl_resolv() returns.  It
     * returns a Curl_addrinfo pointer that may not always look the same.
     */
    if(dns)
      hp=dns->addr;
    if(hp) {
      char buf[64];
      unsigned short ip[4];
      Curl_printable_address(hp, buf, sizeof(buf));

      if(4 == sscanf( buf, "%hu.%hu.%hu.%hu",
                      &ip[0], &ip[1], &ip[2], &ip[3])) {
        /* Set DSTIP */
        socksreq[4] = (unsigned char)ip[0];
        socksreq[5] = (unsigned char)ip[1];
        socksreq[6] = (unsigned char)ip[2];
        socksreq[7] = (unsigned char)ip[3];
      }
      else
        hp = NULL; /* fail! */

      infof(data, "SOCKS4 connect to %s (locally resolved)\n", buf);

      Curl_resolv_unlock(data, dns); /* not used anymore from now on */

    }
    if(!hp) {
      failf(data, "Failed to resolve \"%s\" for SOCKS4 connect.",
            hostname);
      return CURLE_COULDNT_RESOLVE_HOST;
    }
  }

  /*
   * This is currently not supporting "Identification Protocol (RFC1413)".
   */
  socksreq[8] = 0; /* ensure empty userid is NUL-terminated */
  if(proxy_name) {
    size_t plen = strlen(proxy_name);
    if(plen >= sizeof(socksreq) - 8) {
      failf(data, "Too long SOCKS proxy name, can't use!\n");
      return CURLE_COULDNT_CONNECT;
    }
    /* copy the proxy name WITH trailing zero */
    memcpy(socksreq + 8, proxy_name, plen+1);
  }

  /*
   * Make connection
   */
  {
    ssize_t actualread;
    ssize_t written;
    ssize_t hostnamelen = 0;
    int packetsize = 9 +
      (int)strlen((char*)socksreq + 8); /* size including NUL */

    /* If SOCKS4a, set special invalid IP address 0.0.0.x */
    if(protocol4a) {
      socksreq[4] = 0;
      socksreq[5] = 0;
      socksreq[6] = 0;
      socksreq[7] = 1;
      /* If still enough room in buffer, also append hostname */
      hostnamelen = (ssize_t)strlen(hostname) + 1; /* length including NUL */
      if(packetsize + hostnamelen <= SOCKS4REQLEN)
        strcpy((char*)socksreq + packetsize, hostname);
      else
        hostnamelen = 0; /* Flag: hostname did not fit in buffer */
    }

    /* Send request */
    code = Curl_write_plain(conn, sock, (char *)socksreq,
                            packetsize + hostnamelen,
                            &written);
    if(code || (written != packetsize + hostnamelen)) {
      failf(data, "Failed to send SOCKS4 connect request.");
      return CURLE_COULDNT_CONNECT;
    }
    if(protocol4a && hostnamelen == 0) {
      /* SOCKS4a with very long hostname - send that name separately */
      hostnamelen = (ssize_t)strlen(hostname) + 1;
      code = Curl_write_plain(conn, sock, (char *)hostname, hostnamelen,
                              &written);
      if(code || (written != hostnamelen)) {
        failf(data, "Failed to send SOCKS4 connect request.");
        return CURLE_COULDNT_CONNECT;
      }
    }

    packetsize = 8; /* receive data size */

    /* Receive response */
    result = Curl_blockread_all(conn, sock, (char *)socksreq, packetsize,
                                &actualread);
    if(result || (actualread != packetsize)) {
      failf(data, "Failed to receive SOCKS4 connect request ack.");
      return CURLE_COULDNT_CONNECT;
    }

    /*
     * Response format
     *
     *     +----+----+----+----+----+----+----+----+
     *     | VN | CD | DSTPORT |      DSTIP        |
     *     +----+----+----+----+----+----+----+----+
     * # of bytes:  1    1      2              4
     *
     * VN is the version of the reply code and should be 0. CD is the result
     * code with one of the following values:
     *
     * 90: request granted
     * 91: request rejected or failed
     * 92: request rejected because SOCKS server cannot connect to
     *     identd on the client
     * 93: request rejected because the client program and identd
     *     report different user-ids
     */

    /* wrong version ? */
    if(socksreq[0] != 0) {
      failf(data,
            "SOCKS4 reply has wrong version, version should be 4.");
      return CURLE_COULDNT_CONNECT;
    }

    /* Result */
    switch(socksreq[1]) {
    case 90:
      infof(data, "SOCKS4%s request granted.\n", protocol4a?"a":"");
      break;
    case 91:
      failf(data,
            "Can't complete SOCKS4 connection to %d.%d.%d.%d:%d. (%d)"
            ", request rejected or failed.",
            (unsigned char)socksreq[4], (unsigned char)socksreq[5],
            (unsigned char)socksreq[6], (unsigned char)socksreq[7],
            ((socksreq[8] << 8) | socksreq[9]),
            socksreq[1]);
      return CURLE_COULDNT_CONNECT;
    case 92:
      failf(data,
            "Can't complete SOCKS4 connection to %d.%d.%d.%d:%d. (%d)"
            ", request rejected because SOCKS server cannot connect to "
            "identd on the client.",
            (unsigned char)socksreq[4], (unsigned char)socksreq[5],
            (unsigned char)socksreq[6], (unsigned char)socksreq[7],
            ((socksreq[8] << 8) | socksreq[9]),
            socksreq[1]);
      return CURLE_COULDNT_CONNECT;
    case 93:
      failf(data,
            "Can't complete SOCKS4 connection to %d.%d.%d.%d:%d. (%d)"
            ", request rejected because the client program and identd "
            "report different user-ids.",
            (unsigned char)socksreq[4], (unsigned char)socksreq[5],
            (unsigned char)socksreq[6], (unsigned char)socksreq[7],
            ((socksreq[8] << 8) | socksreq[9]),
            socksreq[1]);
      return CURLE_COULDNT_CONNECT;
    default:
      failf(data,
            "Can't complete SOCKS4 connection to %d.%d.%d.%d:%d. (%d)"
            ", Unknown.",
            (unsigned char)socksreq[4], (unsigned char)socksreq[5],
            (unsigned char)socksreq[6], (unsigned char)socksreq[7],
            ((socksreq[8] << 8) | socksreq[9]),
            socksreq[1]);
      return CURLE_COULDNT_CONNECT;
    }
  }

  (void)curlx_nonblock(sock, TRUE);

  return CURLE_OK; /* Proxy was successful! */
}